

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::GetToken(Parser *this)

{
  bool bVar1;
  Token *this_00;
  undefined1 local_58 [8];
  Token temp;
  Parser *this_local;
  
  temp.type.field_2._8_8_ = this;
  Lexer::Get((Token *)local_58,&this->lexer);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &temp.lineIndex,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (anonymous_namespace)::WHITESPACE_abi_cxx11_);
  if ((bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &temp.lineIndex,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (anonymous_namespace)::COMMENT_abi_cxx11_), bVar1)) {
    this_00 = (Token *)operator_new(0x48);
    Token::Token(this_00,(Token *)local_58);
    this->token = this_00;
  }
  else {
    GetToken(this);
  }
  Token::~Token((Token *)local_58);
  return;
}

Assistant:

void Parser::GetToken()
{
	Token temp = lexer.Get();

	if (temp.type != WHITESPACE && temp.type != COMMENT)
		token = new Token(temp);
	else
		GetToken();
}